

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O0

shared_ptr<pstack::Elf::Object> __thiscall
pstack::Context::getImageIfLoaded(Context *this,string *name)

{
  bool bVar1;
  pointer ppVar2;
  key_type *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  shared_ptr<pstack::Elf::Object> sVar4;
  _Self local_30;
  _Self local_28;
  iterator it;
  string *name_local;
  Context *this_local;
  
  elfLookups = elfLookups + 1;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pstack::Elf::Object>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pstack::Elf::Object>_>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pstack::Elf::Object>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pstack::Elf::Object>_>_>_>
               *)&name[1].field_2,in_RDX);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pstack::Elf::Object>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pstack::Elf::Object>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pstack::Elf::Object>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pstack::Elf::Object>_>_>_>
              *)&name[1].field_2);
  bVar1 = std::operator==(&local_28,&local_30);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::shared_ptr<pstack::Elf::Object>::shared_ptr((shared_ptr<pstack::Elf::Object> *)this);
    _Var3._M_pi = extraout_RDX_00;
  }
  else {
    elfHits = elfHits + 1;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pstack::Elf::Object>_>_>
             ::operator->(&local_28);
    std::shared_ptr<pstack::Elf::Object>::shared_ptr
              ((shared_ptr<pstack::Elf::Object> *)this,&ppVar2->second);
    _Var3._M_pi = extraout_RDX;
  }
  sVar4.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  sVar4.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<pstack::Elf::Object>)
         sVar4.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Elf::Object>
Context::getImageIfLoaded(const std::string &name)
{
    elfLookups++;
    auto it = elfCache.find(name);
    if (it != elfCache.end()) {
        elfHits++;
        return it->second;
    }
    return {};
}